

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<int_const*,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> b2,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> e2)

{
  bool bVar1;
  iuStreamMessage *piVar2;
  AssertionResult *rhs;
  AssertionResult *this_00;
  ulong uVar3;
  Message ar;
  int local_22c;
  uint local_228;
  int local_224;
  AssertionResult *local_220;
  int *local_218;
  AssertionResult local_210;
  iuutil *local_1e8;
  AssertionResult local_1e0;
  iuStreamMessage local_1b8;
  
  local_220 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
  uVar3 = (long)b1 - (long)this;
  local_224 = (int)e1 - (int)b2._M_current;
  local_228 = (uint)CONCAT71((uint7)(uint3)((uint)local_224 >> 8),1);
  local_22c = 0;
  local_218 = (int *)b2._M_current;
  local_1e8 = (iuutil *)b1;
  for (; this != local_1e8; this = this + 4) {
    if (e1 == local_218) {
      local_210.m_message._M_dataplus._M_p._0_4_ = local_22c + (int)(uVar3 >> 2);
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_210);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar2,&local_22c);
      this_00 = local_220;
      goto LAB_0016a021;
    }
    iutest::internal::CmpHelperEQ<int,char>
              (&local_1e0,(internal *)0x16f26a,"",(char *)this,e1,e2._M_current);
    iutest::AssertionResult::operator!(&local_210,&local_1e0);
    bVar1 = local_210.m_result;
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (bVar1 == true) {
      piVar2 = iutest::detail::iuStreamMessage::operator<<
                         (&local_1b8,(char (*) [25])"\nMismatch in a position ");
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_22c);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [3])0x16cec8);
      iutest::PrintToString<int>(&local_210.m_message,(int *)this);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_210.m_message);
      piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
      iutest::PrintToString<char>(&local_1e0.m_message,(char *)e1);
      iutest::detail::iuStreamMessage::operator<<(piVar2,&local_1e0.m_message);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_210);
      local_228 = 0;
    }
    e1 = (int *)((long)e1 + 1);
    local_22c = local_22c + 1;
    uVar3 = uVar3 - 4;
    local_224 = local_224 + 1;
  }
  if (e1 == local_218) {
    this_00 = local_220;
    if ((local_228 & 1) != 0) {
      (local_220->m_message)._M_dataplus._M_p = (pointer)&(local_220->m_message).field_2;
      (local_220->m_message)._M_string_length = 0;
      (local_220->m_message).field_2._M_local_buf[0] = '\0';
      local_220->m_result = true;
      goto LAB_0016a05d;
    }
  }
  else {
    local_210.m_message._M_dataplus._M_p._0_4_ = local_22c - local_224;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       (&local_1b8,(char (*) [21])"\nMismatch element : ");
    this_00 = local_220;
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_22c);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)&local_210);
  }
LAB_0016a021:
  local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
  local_210.m_message._M_string_length = 0;
  local_210.m_message.field_2._M_local_buf[0] = '\0';
  local_210.m_result = false;
  rhs = iutest::AssertionResult::operator<<(&local_210,&local_1b8);
  iutest::AssertionResult::AssertionResult(this_00,rhs);
  std::__cxx11::string::~string((string *)&local_210);
LAB_0016a05d:
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  return this_00;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}